

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example3.cpp
# Opt level: O0

int main(void)

{
  Medium med;
  PointLight *pPVar1;
  Scene *pSVar2;
  Sphere *pSVar3;
  Plane *pPVar4;
  Vector local_330;
  Vector local_318;
  Vector local_300;
  Vector local_2e8;
  Vector local_2d0;
  Vector local_2b8;
  SurfaceData local_2a0;
  Vector local_218;
  SurfaceData local_200;
  Vector local_178;
  SurfaceData local_160;
  double local_d8;
  double dStack_d0;
  Vector local_c0;
  Vector local_a8;
  Vector local_90;
  Vector local_78;
  Vector local_60;
  Scene *local_38;
  Scene *scene;
  PointLight *Light1;
  Plane *p;
  Sphere *s3;
  Sphere *s2;
  Sphere *s1;
  
  pSVar2 = (Scene *)operator_new(0xe8);
  Scene::Scene(pSVar2);
  local_38 = pSVar2;
  pSVar3 = (Sphere *)operator_new(200);
  Vector::Vector(&local_60,0.0,1.0,5.0);
  Sphere::Sphere(pSVar3,&local_60,1.5);
  s2 = pSVar3;
  pSVar3 = (Sphere *)operator_new(200);
  Vector::Vector(&local_78,-3.0,0.0,4.0);
  Sphere::Sphere(pSVar3,&local_78,1.0);
  s3 = pSVar3;
  pSVar3 = (Sphere *)operator_new(200);
  Vector::Vector(&local_90,3.0,0.0,4.0);
  Sphere::Sphere(pSVar3,&local_90,1.0);
  p = (Plane *)pSVar3;
  pPVar4 = (Plane *)operator_new(0xc0);
  Vector::Vector(&local_a8,0.0,1.0,0.0);
  Plane::Plane(pPVar4,&local_a8,1.0);
  Light1 = (PointLight *)pPVar4;
  GeometricObject::ambient(&s2->super_GeometricObject,0.2);
  GeometricObject::diffuse(&s2->super_GeometricObject,0.5);
  GeometricObject::specular(&s2->super_GeometricObject,0.6);
  GeometricObject::reflection(&s2->super_GeometricObject,0.0);
  GeometricObject::transmittance(&s2->super_GeometricObject,0.0);
  GeometricObject::phong_size(&s2->super_GeometricObject,0x1e);
  pSVar3 = s2;
  Vector::Vector(&local_c0,1.0,1.0,0.0);
  GeometricObject::color(&pSVar3->super_GeometricObject,&local_c0);
  local_d8 = Grayzer::Medium::glass.ior;
  dStack_d0 = Grayzer::Medium::glass.beta;
  med.beta = Grayzer::Medium::glass.beta;
  med.ior = Grayzer::Medium::glass.ior;
  GeometricObject::medium(&s2->super_GeometricObject,med);
  pSVar3 = s3;
  GeometricObject::surface_data(&local_160,&s2->super_GeometricObject);
  GeometricObject::surface_data(&pSVar3->super_GeometricObject,&local_160);
  pSVar3 = s3;
  Vector::Vector(&local_178,1.0,0.0,0.0);
  GeometricObject::color(&pSVar3->super_GeometricObject,&local_178);
  pPVar4 = p;
  GeometricObject::surface_data(&local_200,&s2->super_GeometricObject);
  GeometricObject::surface_data(&pPVar4->super_GeometricObject,&local_200);
  pPVar4 = p;
  Vector::Vector(&local_218,0.0,0.0,1.0);
  GeometricObject::color(&pPVar4->super_GeometricObject,&local_218);
  pPVar1 = Light1;
  GeometricObject::surface_data(&local_2a0,&s2->super_GeometricObject);
  GeometricObject::surface_data((GeometricObject *)pPVar1,&local_2a0);
  GeometricObject::ambient((GeometricObject *)Light1,0.1);
  GeometricObject::diffuse((GeometricObject *)Light1,0.5);
  GeometricObject::specular((GeometricObject *)Light1,0.4);
  GeometricObject::reflection((GeometricObject *)Light1,0.4);
  pPVar1 = Light1;
  Vector::Vector(&local_2b8,0.0,0.0,1.0);
  GeometricObject::color((GeometricObject *)pPVar1,&local_2b8);
  GeometricObject::reflection(&s2->super_GeometricObject,0.3);
  pSVar2 = (Scene *)operator_new(0x40);
  Vector::Vector(&local_2d0,10.0,5.0,-10.0);
  PointLight::PointLight((PointLight *)pSVar2,&local_2d0,17.0);
  scene = pSVar2;
  Scene::add(local_38,&s2->super_GeometricObject);
  Scene::add(local_38,&s3->super_GeometricObject);
  Scene::add(local_38,&p->super_GeometricObject);
  Scene::add(local_38,(GeometricObject *)Light1);
  Scene::add(local_38,(LightSource *)scene);
  pSVar2 = local_38;
  Vector::Vector(&local_2e8,0.196078,0.6,0.8);
  Scene::setBackground(pSVar2,&local_2e8);
  pSVar2 = local_38;
  Vector::Vector(&local_300,0.0);
  Vector::Vector(&local_318,0.0,0.0,1.0);
  Vector::Vector(&local_330,0.0,1.0,0.0);
  Scene::setCamera(pSVar2,&local_300,&local_318,&local_330);
  render_scene(local_38,1.5,1.0,300,200,"SAMPLE30.TGA");
  distributed_render_scene(local_38,1.5,1.0,300,200,5,5,"SAMPLE31.TGA");
  return 0;
}

Assistant:

int main()
{
    Sphere *s1,*s2,*s3;
    Plane *p;
    PointLight *Light1;

    Scene* scene = new Scene();
    s1 = new Sphere(Vector(0,1,5),1.5);
    s2 = new Sphere(Vector(-3,0,4),1);
    s3 = new Sphere(Vector(3,0,4),1);
    p = new Plane(Vector(0,1,0),1);
    s1->ambient(0.2);
    s1->diffuse(0.5);
    s1->specular(0.6);
    s1->reflection(0.0);
    s1->transmittance(0.0);
    s1->phong_size(30);
    s1->color(Yellow);
    s1->medium(Grayzer::Medium::glass);

    s2->surface_data(s1->surface_data());
    s2->color(Red);

    s3->surface_data(s1->surface_data());
    s3->color(Blue);

    p->surface_data(s1->surface_data());
    p->ambient(0.1);
    p->diffuse(0.5);
    p->specular(0.4);
    p->reflection(0.4);
    p->color(Blue);

    s1->reflection(0.3);

    Light1 = new PointLight(Vector(10,5,-10),17);
    scene->add(s1);
    scene->add(s2);
    scene->add(s3);
    scene->add(p);
    scene->add(Light1);
    scene->setBackground(SkyBlue);
    scene->setCamera(Vector(0),Vector(0,0,1),Vector(0,1,0));
    render_scene(scene, 1.5,1.0,300,200,"SAMPLE30.TGA");
    distributed_render_scene(scene, 1.5,1.0,300,200,5,5,"SAMPLE31.TGA");
}